

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

Ignored __thiscall
re2::NamedCapturesWalker::PreVisit(NamedCapturesWalker *this,Regexp *re,Ignored ignored,bool *stop)

{
  mapped_type mVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var2;
  iterator iVar3;
  mapped_type *pmVar4;
  string *__k;
  
  if ((re->op_ == '\v') && (__k = (re->field_7).field_1.name_, __k != (string *)0x0)) {
    this_00 = &this->map_->_M_t;
    if (this_00 ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x0) {
      this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)operator_new(0x30);
      p_Var2 = &(((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header;
      (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_color = _S_red;
      (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_left =
           &p_Var2->_M_header;
      (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_right =
           &p_Var2->_M_header;
      (((_Rep_type *)&this_00->_M_impl)->_M_impl).super__Rb_tree_header._M_node_count = 0;
      this->map_ = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)this_00;
      __k = (re->field_7).field_1.name_;
    }
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(this_00,__k);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->map_->_M_t)._M_impl.super__Rb_tree_header) {
      if (re->op_ != '\v') {
        __assert_fail("(op_) == (kRegexpCapture)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h"
                      ,0x14b,"int re2::Regexp::cap()");
      }
      mVar1 = (re->field_7).field_0.max_;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](this->map_,(re->field_7).field_1.name_);
      *pmVar4 = mVar1;
    }
  }
  return ignored;
}

Assistant:

Ignored PreVisit(Regexp* re, Ignored ignored, bool* stop) {
    if (re->op() == kRegexpCapture && re->name() != NULL) {
      // Allocate map once we find a name.
      if (map_ == NULL)
        map_ = new map<string, int>;

      // Record first occurrence of each name.
      // (The rule is that if you have the same name
      // multiple times, only the leftmost one counts.)
      if (map_->find(*re->name()) == map_->end())
        (*map_)[*re->name()] = re->cap();
    }
    return ignored;
  }